

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>
::convertTo<QByteArray>
          (QByteArray *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>
          *this)

{
  char *__dest;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *size;
  
  QByteArray::isNull((QByteArray *)this);
  size = (char *)((this->a).b.d.size +
                  *(qsizetype *)((long)&(this->a).a.a.a.a.a.a + 0x10) +
                  *(qsizetype *)((long)&(this->a).a.a.a.a.a.a + 0x30) +
                  *(qsizetype *)((long)&(this->a).a.a.a.a.b.d + 0x10) + (this->a).a.a.b.d.size + 5);
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(qsizetype)size,Uninitialized);
  __dest = (__return_storage_ptr__->d).ptr;
  sVar1 = *(qsizetype *)((long)&(this->a).a.a.a.a.a.a + 0x10);
  if (sVar1 != 0) {
    memcpy(__dest,*(char **)((long)&(this->a).a.a.a.a.a.a + 8),sVar1);
  }
  pcVar2 = __dest + sVar1;
  pcVar3 = pcVar2 + 1;
  *pcVar2 = *(char *)((long)&(this->a).a.a.a.a.a.a + 0x18);
  sVar1 = *(qsizetype *)((long)&(this->a).a.a.a.a.a.a + 0x30);
  if (sVar1 != 0) {
    memcpy(pcVar3,*(char **)((long)&(this->a).a.a.a.a.a.a + 0x28),sVar1);
  }
  pcVar3 = pcVar3 + sVar1;
  pcVar2 = pcVar3 + 1;
  *pcVar3 = (this->a).a.a.a.a.a.b;
  sVar1 = *(qsizetype *)((long)&(this->a).a.a.a.a.b.d + 0x10);
  if (sVar1 != 0) {
    memcpy(pcVar2,*(char **)((long)&(this->a).a.a.a.a.b.d + 8),sVar1);
  }
  pcVar2 = pcVar2 + sVar1;
  pcVar3 = pcVar2 + 1;
  *pcVar2 = (this->a).a.a.a.b;
  sVar1 = (this->a).a.a.b.d.size;
  if (sVar1 != 0) {
    memcpy(pcVar3,(this->a).a.a.b.d.ptr,sVar1);
  }
  pcVar2 = pcVar3 + sVar1 + 1;
  pcVar3[sVar1] = (this->a).a.b;
  sVar1 = (this->a).b.d.size;
  if (sVar1 != 0) {
    memcpy(pcVar2,(this->a).b.d.ptr,sVar1);
  }
  pcVar2[sVar1] = this->b;
  if (size != pcVar2 + (sVar1 - (long)__dest) + 1) {
    QByteArray::resize(__return_storage_ptr__,(qsizetype)(pcVar2 + (sVar1 - (long)__dest) + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }